

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolSetPrintLevel_Newton(SUNNonlinearSolver NLS,int print_level)

{
  int iVar1;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    iVar1 = -0x385;
  }
  else {
    iVar1 = -0x387;
    if ((uint)print_level < 2) {
      *(int *)((long)NLS->content + 0x50) = print_level;
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int SUNNonlinSolSetPrintLevel_Newton(SUNNonlinearSolver NLS,
                                     int print_level)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check for valid print level */
  if (print_level < 0 || print_level > 1)
    return(SUN_NLS_ILL_INPUT);

  NEWTON_CONTENT(NLS)->print_level = print_level;

  return(SUN_NLS_SUCCESS);
}